

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetephem.cpp
# Opt level: O0

CEExecOptions * DefineOpts(void)

{
  CEExecOptions *in_RDI;
  CEExecOptions *in_stack_00000060;
  CEExecOptions *opts;
  string *in_stack_fffffffffffffcd8;
  CLOptions *in_stack_fffffffffffffce0;
  allocator *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf8;
  allocator *default_val;
  CEExecOptions *in_stack_fffffffffffffd00;
  allocator *paVar2;
  string *in_stack_fffffffffffffd08;
  allocator *paVar3;
  CLOptions *in_stack_fffffffffffffd10;
  CLOptions *this;
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  undefined1 local_1a9 [40];
  allocator local_181;
  string local_180 [32];
  CEExecOptions *in_stack_fffffffffffffea0;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [55];
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"planetephem",&local_31);
  CEExecOptions::CEExecOptions(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string(local_e8);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  CLOptions::AddProgramDescription(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"p,planet",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,
             "Planet number (1=Mercury, 2=Venus, 4=Mars, 5=Jupiter, 6=Saturn, 7=Uranus, 8=Neptune)",
             &local_131);
  CLOptions::AddIntParam
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,(string *)in_stack_fffffffffffffd00
             ,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  CEExecOptions::AddObserverPars(in_stack_00000060);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"startJD",(allocator *)&stack0xfffffffffffffea7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,"Starting time as a Julian date. Default will be the current Julian date",
             &local_181);
  CEDate::CurrentJD();
  CLOptions::AddDoubleParam
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,(string *)in_stack_fffffffffffffd00
             ,(double)in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea7);
  this = (CLOptions *)local_1a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1a9 + 1),"duration",(allocator *)this);
  paVar3 = &local_1d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d0,
             "Duration for printing out results (in minutes). Results will be printed from \'startJD\' to \'startJD + duration\'. Default is for one 24 hour period"
             ,paVar3);
  CLOptions::AddDoubleParam
            (this,(string *)paVar3,(string *)in_stack_fffffffffffffd00,
             (double)in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string((string *)(local_1a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1a9);
  paVar2 = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"step",paVar2);
  default_val = &local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_220,"Number of minutes between each line of the print out.",default_val);
  CLOptions::AddDoubleParam(this,(string *)paVar3,(string *)paVar2,(double)default_val);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"method",&local_249);
  paVar1 = &local_271;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_270,
             "Method for computing planet positions (\'sofa\' or \'jpl\', default=\'sofa\')",paVar1)
  ;
  paVar1 = &local_299;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"sofa",paVar1);
  CLOptions::AddStringParam(this,(string *)paVar3,(string *)paVar2,(string *)default_val);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  CEExecOptions::AddCorrFilePars(in_stack_fffffffffffffea0);
  return in_RDI;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("planetephem");

    // Add version and description
    opts.AddProgramDescription(std::string() +
        "Returns the apparent ICRS RA,Dec and observed Az,Alt coordinates for " +
        "a given planet for a given observer. It is important also to note " +
        "observed coordinates will be dubious very close to the horizon due " +
        "to the atmospheric correction algorithms employed.");

    // Define the parameters
    opts.AddIntParam("p,planet",
                     "Planet number (1=Mercury, 2=Venus, 4=Mars, 5=Jupiter, 6=Saturn, 7=Uranus, 8=Neptune)",
                     0);

    // Observer parameters
    opts.AddObserverPars();

    // Time information
    opts.AddDoubleParam("startJD",
                        "Starting time as a Julian date. Default will be the current Julian date",
                        CEDate::CurrentJD());
    opts.AddDoubleParam("duration",
                        "Duration for printing out results (in minutes). Results will be printed from 'startJD' to 'startJD + duration'. Default is for one 24 hour period",
                        24.0*60.0);
    opts.AddDoubleParam("step",
                        "Number of minutes between each line of the print out.",
                        30.0);
    opts.AddStringParam("method",
                        "Method for computing planet positions ('sofa' or 'jpl', default='sofa')",
                        "sofa");

    opts.AddCorrFilePars();
    return opts ;
}